

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Clear
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  long in_RDI;
  ChunkHeader *c;
  
  while (*(long *)(**(long **)(in_RDI + 0x10) + 0x10) != 0) {
    **(undefined8 **)(in_RDI + 0x10) = *(undefined8 *)(**(long **)(in_RDI + 0x10) + 0x10);
    CrtAllocator::Free((void *)0x10a14e);
  }
  *(undefined8 *)(**(long **)(in_RDI + 0x10) + 8) = 0;
  return;
}

Assistant:

void Clear() RAPIDJSON_NOEXCEPT {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        for (;;) {
            ChunkHeader* c = shared_->chunkHead;
            if (!c->next) {
                break;
            }
            shared_->chunkHead = c->next;
            baseAllocator_->Free(c);
        }
        shared_->chunkHead->size = 0;
    }